

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O3

ParseStatus __thiscall HTTPRequest::parse(HTTPRequest *this)

{
  pointer pcVar1;
  pointer pcVar2;
  undefined8 uVar3;
  int iVar4;
  undefined8 *puVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  size_t sVar8;
  char *pcVar9;
  long lVar10;
  undefined8 extraout_RAX;
  ParseStatus PVar11;
  ulong uVar12;
  pointer unaff_R12;
  pointer unaff_R14;
  ulong uVar13;
  undefined1 local_70 [32];
  string local_50;
  
  PVar11 = PARSE_NEW_REQUEST;
  switch(this->status) {
  case WAITING_REQUEST_LINE:
    ReadBuffer::get_line(&this->buffer);
    if ((char *)local_70._8_8_ != (char *)0x0) {
      parse_request_line(this,(char *)local_70._8_8_,local_70._0_8_);
      this->status = WAITING_HEADER;
      goto switchD_00106cf4_caseD_1;
    }
    break;
  case WAITING_HEADER:
switchD_00106cf4_caseD_1:
    while (ReadBuffer::get_line(&this->buffer), (char *)local_70._8_8_ != (char *)0x0) {
      if ((pointer)local_70._0_8_ == (pointer)0x0) {
        pcVar1 = local_70 + 0x10;
        local_70._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Content-Length","");
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&(this->header)._M_t,(key_type *)local_70);
        if ((pointer)local_70._0_8_ != pcVar1) {
          operator_delete((void *)local_70._0_8_);
        }
        if ((_Rb_tree_header *)iVar6._M_node == &(this->header)._M_t._M_impl.super__Rb_tree_header)
        {
          uVar13 = 0;
          lVar10 = 0x98;
        }
        else {
          local_70._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Content-Length","");
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->header,(key_type *)local_70);
          pcVar2 = (pmVar7->_M_dataplus)._M_p;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar2,pcVar2 + pmVar7->_M_string_length);
          sVar8 = string_to_size_t(&local_50);
          this->content_length = sVar8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((pointer)local_70._0_8_ != pcVar1) {
            operator_delete((void *)local_70._0_8_);
          }
          if (this->content != (char *)0x0) {
            operator_delete(this->content);
            this->content = (char *)0x0;
          }
          uVar13 = this->content_length;
          uVar12 = 0xffffffffffffffff;
          if (-1 < (long)uVar13) {
            uVar12 = uVar13;
          }
          pcVar9 = (char *)operator_new__(uVar12);
          this->content = pcVar9;
          lVar10 = 200;
        }
        *(undefined8 *)((long)&(this->method)._M_dataplus._M_p + lVar10) = 0;
        this->status = WAITING_CONTENT;
        goto LAB_00106ebd;
      }
      iVar4 = parse_header_line(this,(char *)local_70._8_8_,local_70._0_8_);
      if (iVar4 != 0) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = "ErrorParseHeader";
        __cxa_throw(puVar5,&char_const*::typeinfo,0);
      }
    }
    break;
  case WAITING_CONTENT:
    uVar13 = this->content_length;
LAB_00106ebd:
    if ((uVar13 != 0) && (uVar13 != this->content_received)) {
      ReadBuffer::get_chars((ReadBuffer *)local_70,(ssize_t)&this->buffer);
      uVar3 = local_70._0_8_;
      if ((char *)local_70._8_8_ == (char *)0x0) {
        return PARSE_FAILED;
      }
      memcpy(this->content + this->content_received,(void *)local_70._8_8_,local_70._0_8_);
      lVar10 = this->content_received;
      this->content_received = (ssize_t)(uVar3 + lVar10);
      if ((pointer)(uVar3 + lVar10) != (pointer)this->content_length) {
        return PARSE_FAILED;
      }
    }
    this->status = GET_A_REQUEST;
    return PARSE_NEW_REQUEST;
  case GET_A_REQUEST:
    goto switchD_00106cf4_caseD_3;
  default:
    parse();
    if (local_50._M_dataplus._M_p != unaff_R14) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((pointer)local_70._0_8_ != unaff_R12) {
      operator_delete((void *)local_70._0_8_);
    }
    _Unwind_Resume(extraout_RAX);
  }
  PVar11 = PARSE_FAILED;
switchD_00106cf4_caseD_3:
  return PVar11;
}

Assistant:

ParseStatus HTTPRequest::parse() {
    const char *str;
    ssize_t size;
    switch (this->status) {
        case WAITING_REQUEST_LINE:
            IF_FALSE_EXIT(this->status == WAITING_REQUEST_LINE);
            std::tie(str, size) = this->buffer.get_line();
            if (str == nullptr) return PARSE_FAILED;
            if (this->parse_request_line(str, size) != 0) throw "ErrorParseRequestLine";
            this->status = WAITING_HEADER;
        case WAITING_HEADER:
            IF_FALSE_EXIT(this->status == WAITING_HEADER);
            while (1) {
                std::tie(str, size) = this->buffer.get_line();
                if (str == nullptr) return PARSE_FAILED;
                if (size != 0) {
                    if (this->parse_header_line(str, size) != 0) throw "ErrorParseHeader";
                } else {
                    if (this->header.find("Content-Length") != this->header.end()) {
                        this->content_length = string_to_size_t(this->header["Content-Length"]);
                        if (this->content != nullptr) {
                            delete this->content;
                            this->content = nullptr;
                        }
                        this->content = new char[this->content_length];
                        this->content_received = 0;
                    } else {
                        this->content_length = 0;
                    }
                    this->status = WAITING_CONTENT;
                    break;
                }
            }
        case WAITING_CONTENT:
            IF_FALSE_EXIT(this->status == WAITING_CONTENT);
            if (this->content_length == 0 || this->content_length == this->content_received) {
                this->status = GET_A_REQUEST;
            } else {
                std::tie(str, size) = this->buffer.get_chars(this->content_length - this->content_received);
                if (str == nullptr) return PARSE_FAILED;
                memcpy(this->content + this->content_received, str, size * sizeof(char));
                this->content_received += size;
                if (this->content_received == this->content_length) {
                    this->status = GET_A_REQUEST;
                } else {
                    return PARSE_FAILED;
                }
            }
        case GET_A_REQUEST:
            IF_FALSE_EXIT(this->status == GET_A_REQUEST);
            return PARSE_NEW_REQUEST;
        default:
            IF_FALSE_EXIT(false);
    }
}